

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateBlockBuilder.cpp
# Opt level: O0

AppStatePtr __thiscall
anon_unknown.dwarf_5bee2::StateBlockBuilder::getNextState(StateBlockBuilder *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  AppStatePtr AVar1;
  StateBlockBuilder *this_local;
  
  std::shared_ptr<AppState>::shared_ptr
            ((shared_ptr<AppState> *)this,(shared_ptr<AppState> *)(in_RSI + 800));
  AVar1.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  AVar1.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_AppState;
  return (AppStatePtr)AVar1.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual AppStatePtr getNextState() override { return m_nextState; }